

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionObjects.cpp
# Opt level: O0

ptr<Value> __thiscall ExceptionObjects::bad_cast(ExceptionObjects *this,string *message)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *message_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bad_cast",&local_39);
  simple_exception(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> ExceptionObjects::bad_cast(const std::string &message) {
    return simple_exception("bad_cast", message);
}